

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form3_ExtractChannel(ExtractChannelForm3 ExtractChannel)

{
  byte bVar1;
  bool bVar2;
  uint8_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint height;
  code *in_RDI;
  Image output;
  uint32_t roiHeight;
  uint32_t roiWidth;
  uint32_t roiY;
  uint32_t roiX;
  uint8_t channelId;
  Image input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  undefined4 in_stack_ffffffffffffff18;
  uint32_t in_stack_ffffffffffffff1c;
  undefined6 in_stack_ffffffffffffff20;
  uint8_t in_stack_ffffffffffffff26;
  uint8_t in_stack_ffffffffffffff27;
  undefined2 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2a;
  undefined1 in_stack_ffffffffffffff2b;
  undefined1 in_stack_ffffffffffffff2c;
  undefined1 in_stack_ffffffffffffff2d;
  undefined1 in_stack_ffffffffffffff2e;
  undefined1 in_stack_ffffffffffffff2f;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  undefined1 local_b8 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff68;
  uint32_t in_stack_ffffffffffffff70;
  uint32_t in_stack_ffffffffffffff74;
  uint32_t in_stack_ffffffffffffff78;
  uint32_t in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  ImageTemplate<unsigned_char> local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_20;
  code *local_8;
  
  this = &local_20;
  local_8 = in_RDI;
  Unit_Test::intensityArray(in_stack_ffffffffffffff1c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this,0);
  uVar3 = (uint8_t)((ulong)this >> 0x38);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             CONCAT13(in_stack_ffffffffffffff2f,
                      CONCAT12(in_stack_ffffffffffffff2e,
                               CONCAT11(in_stack_ffffffffffffff2d,in_stack_ffffffffffffff2c))),
             CONCAT13(in_stack_ffffffffffffff2b,
                      CONCAT12(in_stack_ffffffffffffff2a,in_stack_ffffffffffffff28)),
             in_stack_ffffffffffffff27,in_stack_ffffffffffffff26);
  Test_Helper::uniformRGBImage
            (uVar3,(Image *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d300e);
  uVar4 = PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_48);
  uVar5 = PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_48);
  Unit_Test::fillImage
            ((Image *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
             in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  bVar1 = Test_Helper::randomValue<unsigned_char>(0x1d3062);
  Unit_Test::generateRoi
            ((Image *)CONCAT44(uVar4,uVar5),
             (uint32_t *)
             CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffff2e,
                                     CONCAT15(in_stack_ffffffffffffff2d,
                                              CONCAT14(in_stack_ffffffffffffff2c,
                                                       CONCAT13(in_stack_ffffffffffffff2b,
                                                                CONCAT12(in_stack_ffffffffffffff2a,
                                                                         in_stack_ffffffffffffff28))
                                                      )))),
             (uint32_t *)
             CONCAT17(in_stack_ffffffffffffff27,
                      CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)),
             (uint32_t *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
             (uint32_t *)0x1d3091);
  height = (uint)bVar1;
  (*local_8)(local_b8,&local_48,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
             in_stack_ffffffffffffff74,in_stack_ffffffffffffff70);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,(ulong)bVar1);
  bVar2 = Unit_Test::verifyImage
                    ((Image *)CONCAT17(in_stack_ffffffffffffff27,
                                       CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)
                                      ),(uint8_t)(in_stack_ffffffffffffff1c >> 0x18));
  bVar1 = false;
  if (bVar2) {
    bVar2 = Unit_Test::equalSize
                      ((Image *)CONCAT17(in_stack_ffffffffffffff27,
                                         CONCAT16(in_stack_ffffffffffffff26,
                                                  in_stack_ffffffffffffff20)),
                       in_stack_ffffffffffffff1c,height);
    bVar1 = false;
    if (bVar2) {
      uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::colorCount
                        ((ImageTemplate<unsigned_char> *)local_b8);
      bVar1 = uVar3 == '\x01';
    }
  }
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d315c);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d3169);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)CONCAT44(uVar4,uVar5));
  return (bool)(bVar1 & 1);
}

Assistant:

bool form3_ExtractChannel(ExtractChannelForm3 ExtractChannel)
    {
        const std::vector < uint8_t > intensity = intensityArray( 3 );
        PenguinV_Image::Image input = uniformRGBImage( intensity[0] );
        fillImage( input, 0, 0, input.width(), input.height(), intensity );

        const uint8_t channelId = randomValue<uint8_t>( 3 );

        uint32_t roiX, roiY;
        uint32_t roiWidth, roiHeight;
        generateRoi( input, roiX, roiY, roiWidth, roiHeight );

        const PenguinV_Image::Image output = ExtractChannel( input, roiX, roiY, roiWidth, roiHeight, channelId );

        return verifyImage( output, intensity[channelId] ) && equalSize( output, roiWidth, roiHeight ) && (output.colorCount() == PenguinV_Image::GRAY_SCALE);
    }